

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

int __thiscall GameBoard::init(GameBoard *this,EVP_PKEY_CTX *ctx)

{
  GameBoard *pGVar1;
  int i;
  GameBoard *this_local;
  
  i = 0;
  pGVar1 = this;
  while (i < 0x16) {
    this->gridInfo[1][i][0xb] = -2;
    this->gridInfo[1][i][0] = -2;
    this->gridInfo[0][i][0xb] = -2;
    this->gridInfo[0][i][0] = -2;
    i = i + 1;
    pGVar1 = (GameBoard *)(ulong)(uint)i;
  }
  i = 0;
  while (i < 0xc) {
    this->trans[-1][0][(long)i + 0x24] = -2;
    this->gridInfo[1][0][i] = -2;
    this->gridInfo[0][0x15][i] = -2;
    this->gridInfo[0][0][i] = -2;
    i = i + 1;
    pGVar1 = (GameBoard *)(ulong)(uint)i;
  }
  return (int)pGVar1;
}

Assistant:

void GameBoard::init()
{
    int i;
    for (i = 0; i < MAPHEIGHT + 2; i++) {
        gridInfo[1][i][0] = gridInfo[1][i][MAPWIDTH + 1] = -2;
        gridInfo[0][i][0] = gridInfo[0][i][MAPWIDTH + 1] = -2;
    }
    for (i = 0; i < MAPWIDTH + 2; i++) {
        gridInfo[1][0][i] = gridInfo[1][MAPHEIGHT + 1][i] = -2;
        gridInfo[0][0][i] = gridInfo[0][MAPHEIGHT + 1][i] = -2;
    }
}